

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_server.cpp
# Opt level: O0

string * __thiscall miniros::ServiceServer::getService_abi_cxx11_(ServiceServer *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RSI;
  string *in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4b3cc9);
    bVar1 = Impl::isValid(peVar2);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4b3ce1);
      std::__cxx11::string::string((string *)in_RDI,(string *)peVar2);
      return in_RDI;
    }
  }
  std::__cxx11::string::string((string *)in_RDI);
  return in_RDI;
}

Assistant:

std::string ServiceServer::getService() const
{
  if (impl_ && impl_->isValid())
  {
    return impl_->service_;
  }

  return std::string();
}